

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_log.cpp
# Opt level: O2

void __thiscall Kumu::SyslogLogSink::~SyslogLogSink(SyslogLogSink *this)

{
  (this->super_ILogSink)._vptr_ILogSink = (_func_int **)&PTR__SyslogLogSink_00124ad8;
  closelog();
  ILogSink::~ILogSink(&this->super_ILogSink);
  return;
}

Assistant:

Kumu::SyslogLogSink::~SyslogLogSink()
{
  closelog();
}